

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv_fs_symlink(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,int flags,uv_fs_cb cb)

{
  uv__work *w;
  long *plVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  
  req->type = UV_FS;
  req->active_queue[0] = loop->active_reqs;
  plVar1 = (long *)loop->active_reqs[1];
  req->active_queue[1] = plVar1;
  *plVar1 = (long)req->active_queue;
  loop->active_reqs[1] = req->active_queue;
  req->fs_type = UV_FS_SYMLINK;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  sVar3 = strlen(path);
  sVar4 = strlen(new_path);
  __dest = (char *)malloc(sVar4 + sVar3 + 2);
  req->path = __dest;
  if (__dest == (char *)0x0) {
    iVar2 = -0xc;
  }
  else {
    req->new_path = __dest + sVar3 + 1;
    memcpy(__dest,path,sVar3 + 1);
    memcpy(__dest + sVar3 + 1,new_path,sVar4 + 1);
    req->flags = flags;
    w = &req->work_req;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(w);
      uv__fs_done(w,0);
      iVar2 = (int)req->result;
    }
    else {
      uv__work_submit(loop,w,uv__fs_work,uv__fs_done);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_fs_symlink(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  const char* new_path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(SYMLINK);
  PATH2;
  req->flags = flags;
  POST;
}